

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O3

size_type __thiscall
estl::vector_s<unsigned_int,11ul>::check_range<unsigned_int_const*>
          (vector_s<unsigned_int,11ul> *this,uint *first,uint *last)

{
  range_error *this_00;
  ulong uVar1;
  code *pcVar2;
  undefined *puVar3;
  
  uVar1 = (long)last - (long)first >> 2;
  if ((long)uVar1 < 0) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              ((out_of_range *)this_00,
               "cas::vector_s range constructing/assigning from inverted range.");
    puVar3 = &std::out_of_range::typeinfo;
    pcVar2 = std::out_of_range::~out_of_range;
  }
  else {
    if (uVar1 < 0xc) {
      return uVar1;
    }
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"cas::vector_s constructing/assigning beyond capacity.");
    puVar3 = &std::range_error::typeinfo;
    pcVar2 = std::range_error::~range_error;
  }
  __cxa_throw(this_00,puVar3,pcVar2);
}

Assistant:

size_type check_range(InputIt first, InputIt last)
    {
        const std::int64_t diff_signed = last - first;
        if (diff_signed < 0) {
            ESTL_THROW (std::out_of_range, "cas::vector_s range constructing/assigning from inverted range.");
            return 0;
        }
        const size_type diff = static_cast<size_type>(diff_signed);
        if (diff > capacity()) {
            ESTL_THROW (std::range_error, "cas::vector_s constructing/assigning beyond capacity.");
            return 0;
        }
        return diff;
    }